

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astCoerceValueNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = *arguments;
  sVar1 = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                    (context,*(sysbvm_tuple_t *)(sVar1 + 0x30),*(sysbvm_tuple_t *)(sVar1 + 0x28),
                     arguments[1],*(sysbvm_tuple_t *)(sVar1 + 0x10),(sysbvm_tuple_t *)0x0);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astCoerceValueNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astCoerceValueNode_t **coerceValueNode = (sysbvm_astCoerceValueNode_t**)node;

    return sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(context, (*coerceValueNode)->valueExpression, (*coerceValueNode)->typeExpression, *environment, (*coerceValueNode)->super.sourcePosition, NULL);
}